

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O3

bool __thiscall cmInstalledFile::GetProperty(cmInstalledFile *this,string *prop,string *value)

{
  _Base_ptr p_Var1;
  long lVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  string separator;
  string output;
  undefined1 *local_88;
  char *local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  _Base_ptr local_48;
  _Base_ptr local_40;
  string *local_38;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
          ::find(&(this->Properties)._M_t,prop);
  p_Var4 = &(this->Properties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (cVar3._M_node != p_Var4) {
    local_68 = &local_58;
    local_60 = 0;
    local_58 = 0;
    local_88 = &local_78;
    local_80 = (char *)0x0;
    local_78 = 0;
    p_Var5 = *(_Base_ptr *)(cVar3._M_node + 2);
    p_Var1 = cVar3._M_node[2]._M_parent;
    local_48 = cVar3._M_node;
    local_40 = p_Var4;
    local_38 = value;
    if (p_Var5 != p_Var1) {
      do {
        lVar2 = *(long *)p_Var5;
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
        std::__cxx11::string::_M_append((char *)&local_68,*(ulong *)(lVar2 + 0x28));
        std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,0x4dc654);
        p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
      } while (p_Var5 != p_Var1);
    }
    std::__cxx11::string::_M_assign((string *)local_38);
    cVar3._M_node = local_48;
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
    p_Var4 = local_40;
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
  }
  return cVar3._M_node != p_Var4;
}

Assistant:

bool cmInstalledFile::GetProperty(const std::string& prop,
                                  std::string& value) const
{
  PropertyMapType::const_iterator i = this->Properties.find(prop);
  if (i == this->Properties.end()) {
    return false;
  }

  Property const& property = i->second;

  std::string output;
  std::string separator;

  for (auto ve : property.ValueExpressions) {
    output += separator;
    output += ve->GetInput();
    separator = ";";
  }

  value = output;
  return true;
}